

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::memarg<wasm::WATParser::NullCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,NullCtx *ctx,uint32_t n)

{
  bool bVar1;
  unsigned_long *puVar2;
  uint *puVar3;
  optional<unsigned_long> oVar4;
  Ok local_49;
  _Optional_payload_base<unsigned_int> local_48;
  optional<unsigned_int> a;
  optional<unsigned_long> o;
  unsigned_long uStack_28;
  uint32_t align;
  uint64_t offset;
  uint32_t n_local;
  NullCtx *ctx_local;
  
  uStack_28 = 0;
  oVar4 = Lexer::takeOffset(&ctx->in);
  a.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&a);
  if (bVar1) {
    puVar2 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&a);
    uStack_28 = *puVar2;
  }
  local_48 = (_Optional_payload_base<unsigned_int>)Lexer::takeAlign(&ctx->in);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_48);
  o.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._12_4_ = n;
  if (bVar1) {
    puVar3 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_48);
    o.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._12_4_ = *puVar3;
  }
  NullInstrParserCtx::getMemarg
            ((NullInstrParserCtx *)ctx,uStack_28,
             o.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._12_4_);
  Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_49);
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::MemargT> memarg(Ctx& ctx, uint32_t n) {
  uint64_t offset = 0;
  uint32_t align = n;
  if (auto o = ctx.in.takeOffset()) {
    offset = *o;
  }
  if (auto a = ctx.in.takeAlign()) {
    align = *a;
  }
  return ctx.getMemarg(offset, align);
}